

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
eagerlyEvaluate<kj::(anonymous_namespace)::TestCase5164::run()::__6>
          (Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *this,
          Type *errorHandler,SourceLocation location)

{
  SourceLocation location_00;
  NoInfer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5221:24)>
  *in_RDX;
  SourceLocation local_50;
  Type local_31;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_30;
  OwnPromiseNode local_28 [2];
  Type *errorHandler_local;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  errorHandler_local = errorHandler;
  this_local = (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               this;
  fwd<kj::(anonymous_namespace)::TestCase5164::run()::__6>(in_RDX);
  SourceLocation::SourceLocation
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
             ,"eagerlyEvaluate",0x604,0x31);
  location_00.function = local_50.function;
  location_00.fileName = local_50.fileName;
  location_00.lineNumber = local_50.lineNumber;
  location_00.columnNumber = local_50.columnNumber;
  then<kj::_::IdentityFunc<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::(anonymous_namespace)::TestCase5164::run()::__6>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)
             &local_30,
             (IdentityFunc<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *
             )errorHandler,&local_31,location_00);
  kj::_::spark<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
            (local_28,location);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)this
             ,false,local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(local_28);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
            (&local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::eagerlyEvaluate(ErrorFunc&& errorHandler, SourceLocation location) {
  // See catch_() for commentary.
  return Promise(false, _::spark<_::FixVoid<T>>(then(
      _::IdentityFunc<decltype(errorHandler(instance<Exception&&>()))>(),
      kj::fwd<ErrorFunc>(errorHandler)).node, location));
}